

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O3

Vec_Str_t * Scl_LibertyReadSclStr(Scl_Tree_t *p,int fVerbose,int fVeryVerbose)

{
  uint uVar1;
  void **ppvVar2;
  Scl_Item_t *pTiming;
  float *pfVar3;
  void *__ptr;
  double dVar4;
  __time_t vOut;
  Vec_Ptr_t *vOut_00;
  Vec_Flt_t *__ptr_00;
  Vec_Flt_t *__ptr_01;
  Vec_Flt_t *__ptr_02;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Vec_Ptr_t *vTemples;
  Vec_Str_t *vOut_01;
  char *pcVar9;
  uint *__ptr_03;
  void *pvVar10;
  size_t sVar11;
  char *__dest;
  Vec_Wrd_t *__ptr_04;
  Vec_Ptr_t *pVVar12;
  undefined8 *puVar13;
  ulong uVar14;
  Scl_Item_t *pSVar15;
  long lVar16;
  Scl_Item_t *pSVar17;
  ulong uVar18;
  long lVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  Vec_Ptr_t *vTables [4];
  Vec_Flt_t *vValues;
  Vec_Flt_t *vInd1;
  Vec_Flt_t *vInd0;
  uint local_12c;
  ulong local_128;
  uint local_11c;
  int local_108;
  ulong local_b8;
  timespec local_98;
  Vec_Ptr_t *local_88;
  Vec_Ptr_t *local_80;
  Vec_Ptr_t *local_70;
  ulong local_68;
  long local_60;
  ulong local_58;
  ulong local_50;
  Vec_Flt_t *local_48;
  Vec_Flt_t *local_40;
  Vec_Flt_t *local_38;
  
  vTemples = Scl_LibertyReadTemplates(p);
  vOut_01 = (Vec_Str_t *)malloc(0x10);
  vOut_01->nCap = 10000;
  pcVar9 = (char *)malloc(10000);
  vOut_01->pArray = pcVar9;
  vOut_01->nSize = 1;
  *pcVar9 = '\b';
  pcVar9 = Scl_LibertyReadString(p,p->pItems->Head);
  Vec_StrPutS_(vOut_01,pcVar9);
  pcVar9 = Scl_LibertyReadDefaultWireLoad(p);
  Vec_StrPutS_(vOut_01,pcVar9);
  pcVar9 = Scl_LibertyReadDefaultWireLoadSel(p);
  Vec_StrPutS_(vOut_01,pcVar9);
  fVar20 = Scl_LibertyReadDefaultMaxTrans(p);
  Vec_StrPutF_(vOut_01,fVar20);
  iVar5 = Scl_LibertyReadTimeUnit(p);
  Vec_StrPutI_(vOut_01,iVar5);
  Scl_LibertyReadLoadUnit(p,vOut_01);
  Scl_LibertyReadWireLoad(p,vOut_01);
  Scl_LibertyReadWireLoadSelect(p,vOut_01);
  uVar1 = p->pItems->Child;
  if (p->nItems <= (int)uVar1) {
LAB_00464e1b:
    __assert_fail("v < p->nItems",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLiberty.c"
                  ,0x4d,"Scl_Item_t *Scl_LibertyItem(Scl_Tree_t *, int)");
  }
  if ((int)uVar1 < 0) {
    local_11c = 0;
    iVar5 = 0;
    iVar8 = 0;
    local_108 = 0;
  }
  else {
    pSVar17 = p->pItems + uVar1;
    local_108 = 0;
    iVar8 = 0;
    iVar5 = 0;
    local_11c = 0;
    do {
      iVar7 = (pSVar17->Key).Beg;
      iVar6 = (pSVar17->Key).End - iVar7;
      iVar7 = strncmp(p->pContents + iVar7,"cell",(long)iVar6);
      if (iVar6 == 4 && iVar7 == 0) {
        iVar7 = Scl_LibertyReadCellIsFlop(p,pSVar17);
        if (iVar7 == 0) {
          iVar7 = Scl_LibertyReadCellIsDontUse(p,pSVar17);
          if (iVar7 == 0) {
            iVar7 = Scl_LibertyReadCellIsThreeState(p,pSVar17);
            if (iVar7 == 0) {
              iVar7 = Scl_LibertyReadCellOutputNum(p,pSVar17);
              if (iVar7 == 0) {
                if (fVeryVerbose != 0) {
                  pcVar9 = Scl_LibertyReadString(p,pSVar17->Head);
                  printf("Scl_LibertyReadGenlib() skipped cell \"%s\" without logic function.\n",
                         pcVar9);
                }
                local_108 = local_108 + 1;
              }
              else {
                local_11c = local_11c + 1;
              }
            }
            else {
              if (fVeryVerbose != 0) {
                pcVar9 = Scl_LibertyReadString(p,pSVar17->Head);
                printf("Scl_LibertyReadGenlib() skipped three-state cell \"%s\".\n",pcVar9);
              }
              iVar8 = iVar8 + 1;
            }
          }
          else if (fVeryVerbose != 0) {
            pcVar9 = Scl_LibertyReadString(p,pSVar17->Head);
            printf("Scl_LibertyReadGenlib() skipped cell \"%s\" due to dont_use attribute.\n",pcVar9
                  );
          }
        }
        else {
          if (fVeryVerbose != 0) {
            pcVar9 = Scl_LibertyReadString(p,pSVar17->Head);
            printf("Scl_LibertyReadGenlib() skipped sequential cell \"%s\".\n",pcVar9);
          }
          iVar5 = iVar5 + 1;
        }
      }
      uVar1 = pSVar17->Next;
      if (p->nItems <= (int)uVar1) goto LAB_00464e1b;
    } while ((-1 < (int)uVar1) && (pSVar17 = p->pItems + uVar1, p->pItems != (Scl_Item_t *)0x0));
  }
  Vec_StrPutI_(vOut_01,local_11c);
  uVar1 = p->pItems->Child;
  if (p->nItems <= (int)uVar1) goto LAB_00464e1b;
  if (-1 < (int)uVar1) {
    pSVar17 = p->pItems + uVar1;
    do {
      iVar7 = (pSVar17->Key).Beg;
      iVar6 = (pSVar17->Key).End - iVar7;
      iVar7 = strncmp(p->pContents + iVar7,"cell",(long)iVar6);
      if ((((iVar6 == 4 && iVar7 == 0) && (iVar7 = Scl_LibertyReadCellIsFlop(p,pSVar17), iVar7 == 0)
           ) && (iVar7 = Scl_LibertyReadCellIsDontUse(p,pSVar17), iVar7 == 0)) &&
         ((iVar7 = Scl_LibertyReadCellIsThreeState(p,pSVar17), iVar7 == 0 &&
          (iVar7 = Scl_LibertyReadCellOutputNum(p,pSVar17), iVar7 != 0)))) {
        pcVar9 = Scl_LibertyReadString(p,pSVar17->Head);
        Vec_StrPutS_(vOut_01,pcVar9);
        pcVar9 = Scl_LibertyReadCellArea(p,pSVar17);
        fVar20 = 1.0;
        if (pcVar9 != (char *)0x0) {
          dVar4 = atof(pcVar9);
          fVar20 = (float)dVar4;
        }
        Vec_StrPutF_(vOut_01,fVar20);
        pcVar9 = Scl_LibertyReadCellLeakage(p,pSVar17);
        if (pcVar9 == (char *)0x0) {
          fVar20 = 0.0;
        }
        else {
          dVar4 = atof(pcVar9);
          fVar20 = (float)dVar4;
        }
        Vec_StrPutF_(vOut_01,fVar20);
        iVar7 = Scl_LibertyReadDeriveStrength(p,pSVar17);
        Vec_StrPutI_(vOut_01,iVar7);
        iVar7 = Scl_LibertyReadCellOutputNum(p,pSVar17);
        iVar6 = Scl_LibertyItemNum(p,pSVar17,"pin");
        Vec_StrPutI_(vOut_01,iVar6 - iVar7);
        Vec_StrPutI_(vOut_01,iVar7);
        __ptr_03 = (uint *)malloc(0x10);
        __ptr_03[0] = 0x10;
        __ptr_03[1] = 0;
        pvVar10 = malloc(0x80);
        *(void **)(__ptr_03 + 2) = pvVar10;
        uVar1 = pSVar17->Child;
        uVar18 = (ulong)uVar1;
        iVar7 = p->nItems;
        if (iVar7 <= (int)uVar1) goto LAB_00464e1b;
        local_b8 = 0;
        if ((-1 < (int)uVar1) && (p->pItems != (Scl_Item_t *)0x0)) {
          pSVar15 = p->pItems + uVar18;
          local_b8 = 0;
          local_128 = 0x10;
          do {
            iVar7 = (pSVar15->Key).Beg;
            iVar6 = (pSVar15->Key).End - iVar7;
            iVar7 = strncmp(p->pContents + iVar7,"pin",(long)iVar6);
            if ((iVar6 == 3 && iVar7 == 0) &&
               (pcVar9 = Scl_LibertyReadPinFormula(p,pSVar15), pcVar9 == (char *)0x0)) {
              iVar7 = Scl_LibertyReadPinDirection(p,pSVar15);
              if (iVar7 != 0) {
                __assert_fail("Scl_LibertyReadPinDirection(p, pPin) == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLiberty.c"
                              ,0x5f8,"Vec_Str_t *Scl_LibertyReadSclStr(Scl_Tree_t *, int, int)");
              }
              pcVar9 = Scl_LibertyReadString(p,pSVar15->Head);
              if (pcVar9 == (char *)0x0) {
                __dest = (char *)0x0;
              }
              else {
                sVar11 = strlen(pcVar9);
                __dest = (char *)malloc(sVar11 + 1);
                strcpy(__dest,pcVar9);
              }
              iVar6 = (int)local_b8;
              iVar7 = (int)local_128;
              if (iVar6 == iVar7) {
                if (iVar7 < 0x10) {
                  if (*(void **)(__ptr_03 + 2) == (void *)0x0) {
                    pvVar10 = malloc(0x80);
                  }
                  else {
                    pvVar10 = realloc(*(void **)(__ptr_03 + 2),0x80);
                  }
                  *(void **)(__ptr_03 + 2) = pvVar10;
                  *__ptr_03 = 0x10;
                  local_128 = 0x10;
                }
                else {
                  local_128 = (ulong)(uint)(iVar7 * 2);
                  if (*(void **)(__ptr_03 + 2) == (void *)0x0) {
                    pvVar10 = malloc(local_128 * 8);
                  }
                  else {
                    pvVar10 = realloc(*(void **)(__ptr_03 + 2),local_128 * 8);
                  }
                  *(void **)(__ptr_03 + 2) = pvVar10;
                  *__ptr_03 = iVar7 * 2;
                }
              }
              else {
                pvVar10 = *(void **)(__ptr_03 + 2);
              }
              local_b8 = (ulong)(iVar6 + 1U);
              __ptr_03[1] = iVar6 + 1U;
              *(char **)((long)pvVar10 + (long)iVar6 * 8) = __dest;
              Vec_StrPutS_(vOut_01,pcVar9);
              fVar20 = Scl_LibertyReadPinCap(p,pSVar15,"capacitance");
              fVar21 = Scl_LibertyReadPinCap(p,pSVar15,"rise_capacitance");
              fVar22 = Scl_LibertyReadPinCap(p,pSVar15,"fall_capacitance");
              Vec_StrPutF_(vOut_01,(float)(~-(uint)(fVar21 == 0.0) & (uint)fVar21 |
                                          -(uint)(fVar21 == 0.0) & (uint)fVar20));
              Vec_StrPutF_(vOut_01,(float)(~-(uint)(fVar22 == 0.0) & (uint)fVar22 |
                                          (uint)fVar20 & -(uint)(fVar22 == 0.0)));
            }
            uVar1 = pSVar15->Next;
            iVar7 = p->nItems;
            if (iVar7 <= (int)uVar1) goto LAB_00464e1b;
          } while ((-1 < (int)uVar1) &&
                  (pSVar15 = p->pItems + uVar1, p->pItems != (Scl_Item_t *)0x0));
          uVar18 = (ulong)(uint)pSVar17->Child;
        }
        if (iVar7 <= (int)uVar18) goto LAB_00464e1b;
        if ((-1 < (int)uVar18) && (p->pItems != (Scl_Item_t *)0x0)) {
          pSVar15 = p->pItems + uVar18;
          uVar18 = local_b8;
          do {
            local_12c = (uint)uVar18;
            iVar7 = (pSVar15->Key).Beg;
            iVar6 = (pSVar15->Key).End - iVar7;
            iVar7 = strncmp(p->pContents + iVar7,"pin",(long)iVar6);
            if ((iVar6 == 3 && iVar7 == 0) &&
               (pcVar9 = Scl_LibertyReadPinFormula(p,pSVar15), pcVar9 != (char *)0x0)) {
              iVar7 = Scl_LibertyReadPinDirection(p,pSVar15);
              if (iVar7 != 1) {
                __assert_fail("Scl_LibertyReadPinDirection(p, pPin) == 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLiberty.c"
                              ,0x60d,"Vec_Str_t *Scl_LibertyReadSclStr(Scl_Tree_t *, int, int)");
              }
              pcVar9 = Scl_LibertyReadString(p,pSVar15->Head);
              Vec_StrPutS_(vOut_01,pcVar9);
              fVar20 = Scl_LibertyReadPinCap(p,pSVar15,"max_capacitance");
              Vec_StrPutF_(vOut_01,fVar20);
              fVar20 = Scl_LibertyReadPinCap(p,pSVar15,"max_transition");
              Vec_StrPutF_(vOut_01,fVar20);
              Vec_StrPutI_(vOut_01,local_12c);
              pcVar9 = Scl_LibertyReadPinFormula(p,pSVar15);
              Vec_StrPutS_(vOut_01,pcVar9);
              __ptr_04 = Mio_ParseFormulaTruth(pcVar9,*(char ***)(__ptr_03 + 2),local_12c);
              if (__ptr_04 == (Vec_Wrd_t *)0x0) {
                return (Vec_Str_t *)0x0;
              }
              uVar18 = 0x25;
              if (local_12c != 0x25) {
                lVar16 = 0;
                do {
                  if (__ptr_04->nSize <= lVar16) {
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                                  ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
                  }
                  uVar18 = __ptr_04->pArray[lVar16];
                  lVar19 = 0;
                  do {
                    uVar1 = vOut_01->nSize;
                    if (uVar1 == vOut_01->nCap) {
                      if ((int)uVar1 < 0x10) {
                        if (vOut_01->pArray == (char *)0x0) {
                          pcVar9 = (char *)malloc(0x10);
                        }
                        else {
                          pcVar9 = (char *)realloc(vOut_01->pArray,0x10);
                        }
                        vOut_01->pArray = pcVar9;
                        vOut_01->nCap = 0x10;
                      }
                      else {
                        sVar11 = (ulong)uVar1 * 2;
                        if (vOut_01->pArray == (char *)0x0) {
                          pcVar9 = (char *)malloc(sVar11);
                        }
                        else {
                          pcVar9 = (char *)realloc(vOut_01->pArray,sVar11);
                        }
                        vOut_01->pArray = pcVar9;
                        vOut_01->nCap = (int)sVar11;
                      }
                    }
                    else {
                      pcVar9 = vOut_01->pArray;
                    }
                    vOut_01->nSize = uVar1 + 1;
                    pcVar9[(int)uVar1] = (char)(uVar18 >> ((byte)lVar19 & 0x3f));
                    lVar19 = lVar19 + 8;
                  } while (lVar19 != 0x40);
                  uVar1 = __ptr_03[1];
                  local_b8 = (ulong)uVar1;
                  if ((int)uVar1 < 7) {
                    uVar18 = (ulong)uVar1;
                    break;
                  }
                  lVar16 = lVar16 + 1;
                  uVar18 = (ulong)uVar1;
                } while (lVar16 < 1 << ((char)uVar1 - 6U & 0x1f));
              }
              if (__ptr_04->pArray != (word *)0x0) {
                free(__ptr_04->pArray);
              }
              free(__ptr_04);
              local_12c = (uint)uVar18;
              if (0 < (int)local_12c) {
                local_60 = *(long *)(__ptr_03 + 2);
                uVar14 = 0;
                local_68 = uVar18;
                do {
                  pcVar9 = *(char **)(local_60 + uVar14 * 8);
                  local_58 = uVar14;
                  pVVar12 = Scl_LibertyReadPinTimingAll(p,pSVar15,pcVar9);
                  Vec_StrPutS_(vOut_01,pcVar9);
                  uVar1 = pVVar12->nSize;
                  uVar18 = (ulong)uVar1;
                  Vec_StrPutI_(vOut_01,(uint)(uVar18 != 0));
                  if (uVar18 == 0) {
                    if (pVVar12->pArray != (void **)0x0) {
                      free(pVVar12->pArray);
                    }
                    free(pVVar12);
                  }
                  else {
                    if ((int)uVar1 < 1) {
                      __assert_fail("i >= 0 && i < p->nSize",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                    }
                    ppvVar2 = pVVar12->pArray;
                    local_70 = pVVar12;
                    local_50 = uVar18;
                    iVar7 = Scl_LibertyReadTimingSense(p,(Scl_Item_t *)*ppvVar2);
                    Vec_StrPutI_(vOut_01,iVar7);
                    lVar16 = 0;
                    do {
                      puVar13 = (undefined8 *)malloc(0x10);
                      *puVar13 = 0x10;
                      pvVar10 = malloc(0x80);
                      puVar13[1] = pvVar10;
                      (&local_98.tv_sec)[lVar16] = (__time_t)puVar13;
                      vOut_00 = local_80;
                      pVVar12 = local_88;
                      lVar19 = local_98.tv_nsec;
                      vOut = local_98.tv_sec;
                      lVar16 = lVar16 + 1;
                    } while (lVar16 != 4);
                    uVar18 = 0;
                    do {
                      pTiming = (Scl_Item_t *)ppvVar2[uVar18];
                      iVar7 = Scl_LibertyScanTable(p,(Vec_Ptr_t *)vOut,pTiming,"cell_rise",vTemples)
                      ;
                      if (((((iVar7 == 0) &&
                            (iVar7 = Scl_LibertyScanTable
                                               (p,(Vec_Ptr_t *)vOut,pTiming,"cell_fall",vTemples),
                            iVar7 == 0)) ||
                           ((iVar7 = Scl_LibertyScanTable
                                               (p,(Vec_Ptr_t *)lVar19,pTiming,"cell_fall",vTemples),
                            iVar7 == 0 &&
                            (iVar7 = Scl_LibertyScanTable
                                               (p,(Vec_Ptr_t *)lVar19,pTiming,"cell_rise",vTemples),
                            iVar7 == 0)))) ||
                          ((iVar7 = Scl_LibertyScanTable
                                              (p,pVVar12,pTiming,"rise_transition",vTemples),
                           iVar7 == 0 &&
                           (iVar7 = Scl_LibertyScanTable
                                              (p,pVVar12,pTiming,"fall_transition",vTemples),
                           iVar7 == 0)))) ||
                         ((iVar7 = Scl_LibertyScanTable
                                             (p,vOut_00,pTiming,"fall_transition",vTemples),
                          iVar7 == 0 &&
                          (iVar7 = Scl_LibertyScanTable
                                             (p,vOut_00,pTiming,"rise_transition",vTemples),
                          iVar7 == 0)))) {
                        puts("Table cannot be found");
                        return (Vec_Str_t *)0x0;
                      }
                      uVar18 = uVar18 + 1;
                    } while (local_50 != uVar18);
                    free(ppvVar2);
                    free(local_70);
                    lVar16 = 0;
                    do {
                      pVVar12 = (Vec_Ptr_t *)(&local_98.tv_sec)[lVar16];
                      Scl_LibertyComputeWorstCase(pVVar12,&local_38,&local_40,&local_48);
                      iVar7 = pVVar12->nSize;
                      if (0 < iVar7) {
                        lVar19 = 0;
                        do {
                          pvVar10 = pVVar12->pArray[lVar19];
                          if (pvVar10 != (void *)0x0) {
                            if (*(void **)((long)pvVar10 + 8) != (void *)0x0) {
                              free(*(void **)((long)pvVar10 + 8));
                            }
                            free(pvVar10);
                            iVar7 = pVVar12->nSize;
                          }
                          lVar19 = lVar19 + 1;
                        } while (lVar19 < iVar7);
                      }
                      if (pVVar12->pArray != (void **)0x0) {
                        free(pVVar12->pArray);
                      }
                      free(pVVar12);
                      __ptr_02 = local_38;
                      __ptr_01 = local_40;
                      __ptr_00 = local_48;
                      Scl_LibertyDumpTables(vOut_01,local_38,local_40,local_48);
                      pfVar3 = __ptr_02->pArray;
                      if (pfVar3 != (float *)0x0) {
                        free(pfVar3);
                      }
                      free(__ptr_02);
                      pfVar3 = __ptr_01->pArray;
                      if (pfVar3 != (float *)0x0) {
                        free(pfVar3);
                      }
                      free(__ptr_01);
                      pfVar3 = __ptr_00->pArray;
                      if (pfVar3 != (float *)0x0) {
                        free(pfVar3);
                      }
                      free(__ptr_00);
                      lVar16 = lVar16 + 1;
                    } while (lVar16 != 4);
                  }
                  uVar14 = local_58 + 1;
                } while (uVar14 != local_68);
                goto LAB_00464be1;
              }
            }
            else {
LAB_00464be1:
              uVar18 = (ulong)local_12c;
            }
            uVar1 = pSVar15->Next;
            if (p->nItems <= (int)uVar1) goto LAB_00464e1b;
          } while ((-1 < (int)uVar1) &&
                  (pSVar15 = p->pItems + uVar1, p->pItems != (Scl_Item_t *)0x0));
        }
        pvVar10 = *(void **)(__ptr_03 + 2);
        if ((int)local_b8 < 1) {
          if (pvVar10 != (void *)0x0) goto LAB_00464c4d;
        }
        else {
          uVar18 = 0;
          do {
            __ptr = *(void **)((long)pvVar10 + uVar18 * 8);
            if ((void *)0x2 < __ptr) {
              free(__ptr);
            }
            uVar18 = uVar18 + 1;
          } while (local_b8 != uVar18);
LAB_00464c4d:
          free(pvVar10);
        }
        free(__ptr_03);
      }
      uVar1 = pSVar17->Next;
      if (p->nItems <= (int)uVar1) goto LAB_00464e1b;
    } while ((-1 < (int)uVar1) && (pSVar17 = p->pItems + uVar1, p->pItems != (Scl_Item_t *)0x0));
  }
  if (vTemples == (Vec_Ptr_t *)0x0) goto LAB_00464d09;
  uVar1 = vTemples->nSize;
  if ((uVar1 & 3) != 0) {
    __assert_fail("Vec_PtrSize(vTemples) % 4 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLiberty.c"
                  ,0x676,"Vec_Str_t *Scl_LibertyReadSclStr(Scl_Tree_t *, int, int)");
  }
  ppvVar2 = vTemples->pArray;
  if ((int)uVar1 < 1) {
    if (ppvVar2 != (void **)0x0) goto LAB_00464cf2;
  }
  else {
    uVar18 = 0;
    do {
      pvVar10 = ppvVar2[uVar18];
      if (pvVar10 != (void *)0x0) {
        if (((uint)uVar18 & 3) - 2 < 2) {
          if (*(void **)((long)pvVar10 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar10 + 8));
          }
        }
        else if ((uVar18 & 3) != 0) goto LAB_00464ce3;
        free(pvVar10);
      }
LAB_00464ce3:
      uVar18 = uVar18 + 1;
    } while (uVar1 != uVar18);
LAB_00464cf2:
    free(ppvVar2);
  }
  free(vTemples);
LAB_00464d09:
  if (fVerbose != 0) {
    pcVar9 = Scl_LibertyReadString(p,p->pItems->Head);
    printf("Library \"%s\" from \"%s\" has %d cells ",pcVar9,p->pFileName,(ulong)local_11c);
    printf("(%d skipped: %d seq; %d tri-state; %d no func; %d dont_use).  ",
           (ulong)(uint)(iVar8 + iVar5 + local_108));
    iVar5 = clock_gettime(3,&local_98);
    if (iVar5 < 0) {
      lVar16 = -1;
    }
    else {
      lVar16 = local_98.tv_nsec / 1000 + local_98.tv_sec * 1000000;
    }
    lVar19 = p->clkStart;
    Abc_Print(1,"%s =","Time");
    Abc_Print(1,"%9.2f sec\n",SUB84((double)(lVar16 - lVar19) / 1000000.0,0));
  }
  return vOut_01;
}

Assistant:

Vec_Str_t * Scl_LibertyReadSclStr( Scl_Tree_t * p, int fVerbose, int fVeryVerbose )
{
    int fUseFirstTable = 0;
    Vec_Str_t * vOut;
    Vec_Ptr_t * vNameIns, * vTemples = NULL;
    Scl_Item_t * pCell, * pPin, * pTiming;
    Vec_Wrd_t * vTruth;
    char * pFormula, * pName;
    int i, k, Counter, nOutputs, nCells;
    int nSkipped[4] = {0};

    // read delay-table templates
    vTemples = Scl_LibertyReadTemplates( p );

    // start the library
    vOut = Vec_StrAlloc( 10000 );
    Vec_StrPutI_( vOut, ABC_SCL_CUR_VERSION );

    // top level information
    Vec_StrPut_( vOut );
    Vec_StrPutS_( vOut, Scl_LibertyReadString(p, Scl_LibertyRoot(p)->Head) );
    Vec_StrPutS_( vOut, Scl_LibertyReadDefaultWireLoad(p) );
    Vec_StrPutS_( vOut, Scl_LibertyReadDefaultWireLoadSel(p) );
    Vec_StrPutF_( vOut, Scl_LibertyReadDefaultMaxTrans(p) );
    Vec_StrPutI_( vOut, Scl_LibertyReadTimeUnit(p) );
    Scl_LibertyReadLoadUnit( p, vOut );
    Vec_StrPut_( vOut );
    Vec_StrPut_( vOut );

    // read wire loads
    Scl_LibertyReadWireLoad( p, vOut );
    Scl_LibertyReadWireLoadSelect( p, vOut );

    // count cells
    nCells = 0;
    Scl_ItemForEachChildName( p, Scl_LibertyRoot(p), pCell, "cell" )
    {
        if ( Scl_LibertyReadCellIsFlop(p, pCell) )
        {
            if ( fVeryVerbose )  printf( "Scl_LibertyReadGenlib() skipped sequential cell \"%s\".\n", Scl_LibertyReadString(p, pCell->Head) );
            nSkipped[0]++;
            continue;
        }
        if ( Scl_LibertyReadCellIsDontUse(p, pCell) )
        {
            if ( fVeryVerbose )  printf( "Scl_LibertyReadGenlib() skipped cell \"%s\" due to dont_use attribute.\n", Scl_LibertyReadString(p, pCell->Head) );
            nSkipped[3]++;
            continue;
        }
        if ( Scl_LibertyReadCellIsThreeState(p, pCell) )
        {
            if ( fVeryVerbose )  printf( "Scl_LibertyReadGenlib() skipped three-state cell \"%s\".\n", Scl_LibertyReadString(p, pCell->Head) );
            nSkipped[1]++;
            continue;
        }
        if ( (Counter = Scl_LibertyReadCellOutputNum(p, pCell)) == 0 )
        {
            if ( fVeryVerbose )  printf( "Scl_LibertyReadGenlib() skipped cell \"%s\" without logic function.\n", Scl_LibertyReadString(p, pCell->Head) );
            nSkipped[2]++;
            continue;
        }
        nCells++;
    }
    // read cells
    Vec_StrPutI_( vOut, nCells );
    Vec_StrPut_( vOut );
    Vec_StrPut_( vOut );
    Scl_ItemForEachChildName( p, Scl_LibertyRoot(p), pCell, "cell" )
    {
        if ( Scl_LibertyReadCellIsFlop(p, pCell) )
            continue;
        if ( Scl_LibertyReadCellIsDontUse(p, pCell) )
            continue;
        if ( Scl_LibertyReadCellIsThreeState(p, pCell) )
            continue;
        if ( (Counter = Scl_LibertyReadCellOutputNum(p, pCell)) == 0 )
            continue;
        // top level information
        Vec_StrPutS_( vOut, Scl_LibertyReadString(p, pCell->Head) );
        pName = Scl_LibertyReadCellArea(p, pCell);
        Vec_StrPutF_( vOut, pName ? atof(pName) : 1 );
        pName = Scl_LibertyReadCellLeakage(p, pCell);
        Vec_StrPutF_( vOut, pName ? atof(pName) : 0 );
        Vec_StrPutI_( vOut, Scl_LibertyReadDeriveStrength(p, pCell) );
        // pin count
        nOutputs = Scl_LibertyReadCellOutputNum( p, pCell );
        Vec_StrPutI_( vOut, Scl_LibertyItemNum(p, pCell, "pin") - nOutputs );
        Vec_StrPutI_( vOut, nOutputs );
        Vec_StrPut_( vOut );
        Vec_StrPut_( vOut );

        // input pins
        vNameIns = Vec_PtrAlloc( 16 );
        Scl_ItemForEachChildName( p, pCell, pPin, "pin" )
        {
            float CapOne, CapRise, CapFall;
            if ( Scl_LibertyReadPinFormula(p, pPin) != NULL ) // skip output pin
                continue;
            assert( Scl_LibertyReadPinDirection(p, pPin) == 0 );
            pName = Scl_LibertyReadString(p, pPin->Head);
            Vec_PtrPush( vNameIns, Abc_UtilStrsav(pName) );
            Vec_StrPutS_( vOut, pName );
            CapOne  = Scl_LibertyReadPinCap( p, pPin, "capacitance" );
            CapRise = Scl_LibertyReadPinCap( p, pPin, "rise_capacitance" );
            CapFall = Scl_LibertyReadPinCap( p, pPin, "fall_capacitance" );
            if ( CapRise == 0 )
                CapRise = CapOne;
            if ( CapFall == 0 )
                CapFall = CapOne;
            Vec_StrPutF_( vOut, CapRise );
            Vec_StrPutF_( vOut, CapFall );
            Vec_StrPut_( vOut );
        }
        Vec_StrPut_( vOut );
        // output pins
        Scl_ItemForEachChildName( p, pCell, pPin, "pin" )
        {
            if ( !Scl_LibertyReadPinFormula(p, pPin) ) // skip input pin
                continue;
            assert( Scl_LibertyReadPinDirection(p, pPin) == 1 );
            pName = Scl_LibertyReadString(p, pPin->Head);
            Vec_StrPutS_( vOut, pName );
            Vec_StrPutF_( vOut, Scl_LibertyReadPinCap( p, pPin, "max_capacitance" ) );
            Vec_StrPutF_( vOut, Scl_LibertyReadPinCap( p, pPin, "max_transition" ) );
            Vec_StrPutI_( vOut, Vec_PtrSize(vNameIns) );
            pFormula = Scl_LibertyReadPinFormula(p, pPin);
            Vec_StrPutS_( vOut, pFormula );
            // write truth table
            vTruth = Mio_ParseFormulaTruth( pFormula, (char **)Vec_PtrArray(vNameIns), Vec_PtrSize(vNameIns) );
            if ( vTruth == NULL )
                return NULL;
            for ( i = 0; i < Abc_Truth6WordNum(Vec_PtrSize(vNameIns)); i++ )
                Vec_StrPutW_( vOut, Vec_WrdEntry(vTruth, i) );
            Vec_WrdFree( vTruth );
            Vec_StrPut_( vOut );
            Vec_StrPut_( vOut );

            // write the delay tables
            if ( fUseFirstTable )
            {
                Vec_PtrForEachEntry( char *, vNameIns, pName, i )
                {
                    pTiming = Scl_LibertyReadPinTiming( p, pPin, pName );
                    Vec_StrPutS_( vOut, pName );
                    Vec_StrPutI_( vOut, (int)(pTiming != NULL) );
                    if ( pTiming == NULL ) // output does not depend on input
                        continue;
                    Vec_StrPutI_( vOut, Scl_LibertyReadTimingSense(p, pTiming) );
                    Vec_StrPut_( vOut );
                    Vec_StrPut_( vOut );
                    // some cells only have 'rise' or 'fall' but not both - here we work around this
                    if ( !Scl_LibertyReadTable( p, vOut, pTiming, "cell_rise",           vTemples ) )
                        if ( !Scl_LibertyReadTable( p, vOut, pTiming, "cell_fall",       vTemples ) )
                                { printf( "Table cannot be found\n" ); return NULL; }                              
                    if ( !Scl_LibertyReadTable( p, vOut, pTiming, "cell_fall",           vTemples ) )
                        if ( !Scl_LibertyReadTable( p, vOut, pTiming, "cell_rise",       vTemples ) )
                                { printf( "Table cannot be found\n" ); return NULL; }                              
                    if ( !Scl_LibertyReadTable( p, vOut, pTiming, "rise_transition",     vTemples ) )
                        if ( !Scl_LibertyReadTable( p, vOut, pTiming, "fall_transition", vTemples ) )
                                { printf( "Table cannot be found\n" ); return NULL; }                              
                    if ( !Scl_LibertyReadTable( p, vOut, pTiming, "fall_transition",     vTemples ) )
                        if ( !Scl_LibertyReadTable( p, vOut, pTiming, "rise_transition", vTemples ) )
                                { printf( "Table cannot be found\n" ); return NULL; }  
                }
                continue;
            }

            // write the timing tables
            Vec_PtrForEachEntry( char *, vNameIns, pName, i )
            {
                Vec_Ptr_t * vTables[4];
                Vec_Ptr_t * vTimings;
                vTimings = Scl_LibertyReadPinTimingAll( p, pPin, pName );
                Vec_StrPutS_( vOut, pName );
                Vec_StrPutI_( vOut, (int)(Vec_PtrSize(vTimings) != 0) );
                if ( Vec_PtrSize(vTimings) == 0 ) // output does not depend on input
                {
                    Vec_PtrFree( vTimings );
                    continue;
                }
                Vec_StrPutI_( vOut, Scl_LibertyReadTimingSense(p, (Scl_Item_t *)Vec_PtrEntry(vTimings, 0)) );
                Vec_StrPut_( vOut );
                Vec_StrPut_( vOut );
                // collect the timing tables
                for ( k = 0; k < 4; k++ )
                    vTables[k] = Vec_PtrAlloc( 16 );
                Vec_PtrForEachEntry( Scl_Item_t *, vTimings, pTiming, k )
                {
                    // some cells only have 'rise' or 'fall' but not both - here we work around this
                    if ( !Scl_LibertyScanTable( p, vTables[0], pTiming, "cell_rise",           vTemples ) )
                        if ( !Scl_LibertyScanTable( p, vTables[0], pTiming, "cell_fall",       vTemples ) )
                                { printf( "Table cannot be found\n" ); return NULL; }                              
                    if ( !Scl_LibertyScanTable( p, vTables[1], pTiming, "cell_fall",           vTemples ) )
                        if ( !Scl_LibertyScanTable( p, vTables[1], pTiming, "cell_rise",       vTemples ) )
                                { printf( "Table cannot be found\n" ); return NULL; }                              
                    if ( !Scl_LibertyScanTable( p, vTables[2], pTiming, "rise_transition",     vTemples ) )
                        if ( !Scl_LibertyScanTable( p, vTables[2], pTiming, "fall_transition", vTemples ) )
                                { printf( "Table cannot be found\n" ); return NULL; }                              
                    if ( !Scl_LibertyScanTable( p, vTables[3], pTiming, "fall_transition",     vTemples ) )
                        if ( !Scl_LibertyScanTable( p, vTables[3], pTiming, "rise_transition", vTemples ) )
                                { printf( "Table cannot be found\n" ); return NULL; }  
                }
                Vec_PtrFree( vTimings );
                // compute worse case of the tables
                for ( k = 0; k < 4; k++ )
                {
                    Vec_Flt_t * vInd0, * vInd1, * vValues;
                    if ( !Scl_LibertyComputeWorstCase( vTables[k], &vInd0, &vInd1, &vValues ) )
                        { printf( "Table indexes have different values\n" ); return NULL; }  
                    Vec_VecFree( (Vec_Vec_t *)vTables[k] );
                    Scl_LibertyDumpTables( vOut, vInd0, vInd1, vValues );
                    Vec_FltFree( vInd0 );
                    Vec_FltFree( vInd1 );
                    Vec_FltFree( vValues );
                }
            }
        }
        Vec_StrPut_( vOut );
        Vec_PtrFreeFree( vNameIns );
    }
    // free templates
    if ( vTemples )
    {
        Vec_Flt_t * vArray;
        assert( Vec_PtrSize(vTemples) % 4 == 0 );
        Vec_PtrForEachEntry( Vec_Flt_t *, vTemples, vArray, i )
        {
            if ( vArray == NULL )
                continue;
            if ( i % 4 == 0 )
                ABC_FREE( vArray );
            else if ( i % 4 == 2 || i % 4 == 3 )
                Vec_FltFree( vArray );
        }
        Vec_PtrFree( vTemples );
    }
    if ( fVerbose )
    {
        printf( "Library \"%s\" from \"%s\" has %d cells ", 
            Scl_LibertyReadString(p, Scl_LibertyRoot(p)->Head), p->pFileName, nCells );
        printf( "(%d skipped: %d seq; %d tri-state; %d no func; %d dont_use).  ", 
            nSkipped[0]+nSkipped[1]+nSkipped[2], nSkipped[0], nSkipped[1], nSkipped[2], nSkipped[3] );
        Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
    }
    return vOut;
}